

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

void __thiscall
toml::
result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::cleanup(result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this,EVP_PKEY_CTX *ctx)

{
  pointer pbVar1;
  pointer pbVar2;
  
  if (this->is_ok_ == true) {
    detail::region::~region(&(this->field_1).succ.value.second);
    std::
    vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
    ::~vector((vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
               *)&(this->field_1).succ);
    return;
  }
  pbVar1 = (this->field_1).succ.value.first.
           super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (pointer)&(this->field_1).succ.value.first.
                     super__Vector_base<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (pbVar1 != pbVar2) {
    operator_delete(pbVar1,*(long *)pbVar2 + 1);
    return;
  }
  return;
}

Assistant:

void cleanup() noexcept
    {
        if(this->is_ok_) {this->succ.~success_type();}
        else             {this->fail.~failure_type();}
        return;
    }